

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateConstructorCode
          (MessageFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  LogMessage *other;
  undefined1 local_a0 [8];
  Formatter format;
  LogMessage local_50;
  Printer *local_18;
  Printer *printer_local;
  MessageFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  bVar1 = IsFieldStripped((this->super_FieldGenerator).descriptor_,
                          (this->super_FieldGenerator).options_);
  if (bVar1) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message_field.cc"
               ,0x1bc);
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: !IsFieldStripped(descriptor_, options_): ");
    internal::LogFinisher::operator=
              ((LogFinisher *)
               ((long)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count + 3),other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  Formatter::Formatter((Formatter *)local_a0,local_18,&(this->super_FieldGenerator).variables_);
  Formatter::operator()<>((Formatter *)local_a0,"$name$_ = nullptr;\n");
  Formatter::~Formatter((Formatter *)local_a0);
  return;
}

Assistant:

void MessageFieldGenerator::GenerateConstructorCode(
    io::Printer* printer) const {
  GOOGLE_CHECK(!IsFieldStripped(descriptor_, options_));

  Formatter format(printer, variables_);
  format("$name$_ = nullptr;\n");
}